

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_parser.tab.cc
# Opt level: O2

void __thiscall
MC::MC_Parser::stack_symbol_type::stack_symbol_type(stack_symbol_type *this,stack_symbol_type *that)

{
  filename_type *pfVar1;
  counter_type cVar2;
  counter_type cVar3;
  counter_type cVar4;
  counter_type cVar5;
  ulong uVar6;
  uint uVar7;
  value_type *this_00;
  
  (this->super_basic_symbol<MC::MC_Parser::by_state>).super_by_state.state =
       (that->super_basic_symbol<MC::MC_Parser::by_state>).super_by_state.state;
  (this->super_basic_symbol<MC::MC_Parser::by_state>).value.yytypeid_ = (type_info *)0x0;
  *(undefined8 *)&(this->super_basic_symbol<MC::MC_Parser::by_state>).value.field_0 = 0;
  *(undefined8 *)((long)&(this->super_basic_symbol<MC::MC_Parser::by_state>).value.field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->super_basic_symbol<MC::MC_Parser::by_state>).value.field_0 + 0x10) =
       0;
  *(undefined8 *)((long)&(this->super_basic_symbol<MC::MC_Parser::by_state>).value.field_0 + 0x18) =
       0;
  pfVar1 = (that->super_basic_symbol<MC::MC_Parser::by_state>).location.begin.filename;
  cVar4 = (that->super_basic_symbol<MC::MC_Parser::by_state>).location.begin.line;
  cVar5 = (that->super_basic_symbol<MC::MC_Parser::by_state>).location.begin.column;
  cVar2 = (that->super_basic_symbol<MC::MC_Parser::by_state>).location.end.line;
  cVar3 = (that->super_basic_symbol<MC::MC_Parser::by_state>).location.end.column;
  (this->super_basic_symbol<MC::MC_Parser::by_state>).location.end.filename =
       (that->super_basic_symbol<MC::MC_Parser::by_state>).location.end.filename;
  (this->super_basic_symbol<MC::MC_Parser::by_state>).location.end.line = cVar2;
  (this->super_basic_symbol<MC::MC_Parser::by_state>).location.end.column = cVar3;
  (this->super_basic_symbol<MC::MC_Parser::by_state>).location.begin.filename = pfVar1;
  (this->super_basic_symbol<MC::MC_Parser::by_state>).location.begin.line = cVar4;
  (this->super_basic_symbol<MC::MC_Parser::by_state>).location.begin.column = cVar5;
  uVar6 = (ulong)(that->super_basic_symbol<MC::MC_Parser::by_state>).super_by_state.state;
  if (uVar6 == 0) goto switchD_00139ebf_caseD_13;
  this_00 = &(this->super_basic_symbol<MC::MC_Parser::by_state>).value;
  uVar7 = *(ushort *)(yystos_ + uVar6 * 2) - 0x102;
  if ((uVar7 < 0x1d) && ((0x1790498bU >> (uVar7 & 0x1f) & 1) != 0)) {
switchD_00139ebf_caseD_14:
    value_type::move<int>(this_00,&(that->super_basic_symbol<MC::MC_Parser::by_state>).value);
  }
  else {
    switch(*(ushort *)(yystos_ + uVar6 * 2)) {
    case 0x12:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x1b:
      value_type::move<std::__cxx11::string>
                (this_00,&(that->super_basic_symbol<MC::MC_Parser::by_state>).value);
      break;
    case 0x14:
    case 0x18:
      goto switchD_00139ebf_caseD_14;
    case 0x19:
      value_type::move<bool>(this_00,&(that->super_basic_symbol<MC::MC_Parser::by_state>).value);
      break;
    case 0x1a:
      value_type::move<float>(this_00,&(that->super_basic_symbol<MC::MC_Parser::by_state>).value);
    }
  }
switchD_00139ebf_caseD_13:
  (that->super_basic_symbol<MC::MC_Parser::by_state>).super_by_state.state = '\0';
  return;
}

Assistant:

MC_Parser::stack_symbol_type::stack_symbol_type (YY_RVREF (stack_symbol_type) that)
    : super_type (YY_MOVE (that.state), YY_MOVE (that.location))
  {
    switch (that.kind ())
    {
      case symbol_kind::S_BOOL: // BOOL
        value.YY_MOVE_OR_COPY< bool > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_APPROXNUM: // APPROXNUM
        value.YY_MOVE_OR_COPY< float > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_COMPARISON: // COMPARISON
      case symbol_kind::S_INTNUM: // INTNUM
      case symbol_kind::S_column_list: // column_list
      case symbol_kind::S_select_expr_list: // select_expr_list
      case symbol_kind::S_table_references: // table_references
      case symbol_kind::S_delete_opts: // delete_opts
      case symbol_kind::S_delete_list: // delete_list
      case symbol_kind::S_insert_opts: // insert_opts
      case symbol_kind::S_insert_vals_list: // insert_vals_list
      case symbol_kind::S_create_col_list: // create_col_list
      case symbol_kind::S_column_atts: // column_atts
      case symbol_kind::S_opt_length: // opt_length
      case symbol_kind::S_opt_binary: // opt_binary
      case symbol_kind::S_opt_uz: // opt_uz
      case symbol_kind::S_data_type: // data_type
        value.YY_MOVE_OR_COPY< int > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_WORD: // WORD
      case symbol_kind::S_HLH: // HLH
      case symbol_kind::S_NAME: // NAME
      case symbol_kind::S_STRING: // STRING
      case symbol_kind::S_USERVAR: // USERVAR
        value.YY_MOVE_OR_COPY< std::string > (YY_MOVE (that.value));
        break;

      default:
        break;
    }

#if 201103L <= YY_CPLUSPLUS
    // that is emptied.
    that.state = empty_state;
#endif
  }